

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall pbrt::syntactic::ParamArray<float>::add(ParamArray<float> *this,string *text)

{
  float fVar1;
  value_type_conflict3 *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  fVar1 = std::__cxx11::stof((string *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                             ,(size_t *)in_stack_ffffffffffffff88);
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)CONCAT44(fVar1,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  return;
}

Assistant:

void ParamArray<float>::add(const std::string &text)
    { this->push_back(std::stof(text.c_str())); }